

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O0

void hang_tick(t_hang_conflict *h)

{
  t_atomtype tVar1;
  _pipe *object;
  t_hang_conflict *ptVar2;
  int iVar3;
  word *local_40;
  word *w;
  t_pipeout *ptStack_30;
  int i;
  t_pipeout *p;
  t_hang_conflict *h3;
  t_hang_conflict *h2;
  t_pipe *x;
  t_hang_conflict *h_local;
  
  object = h->h_owner;
  if (object->x_hang == h) {
    object->x_hang = h->h_next;
  }
  else {
    ptVar2 = object->x_hang;
    do {
      h3 = ptVar2;
      ptVar2 = h3->h_next;
      if (ptVar2 == (t_hang_conflict *)0x0) goto LAB_001d6750;
    } while (ptVar2 != h);
    h3->h_next = ptVar2->h_next;
  }
LAB_001d6750:
  ptStack_30 = object->x_vec + (object->x_n + -1);
  local_40 = h->h_vec + (object->x_n + -1);
  w._4_4_ = object->x_n;
  while (w._4_4_ != 0) {
    tVar1 = (ptStack_30->p_atom).a_type;
    if (tVar1 == A_FLOAT) {
      outlet_float(ptStack_30->p_outlet,local_40->w_float);
    }
    else if (tVar1 == A_SYMBOL) {
      outlet_symbol(ptStack_30->p_outlet,local_40->w_symbol);
    }
    else if (tVar1 == A_POINTER) {
      iVar3 = gpointer_check(local_40->w_gpointer,1);
      if (iVar3 == 0) {
        pd_error(object,"pipe: stale pointer");
      }
      else {
        outlet_pointer(ptStack_30->p_outlet,local_40->w_gpointer);
      }
    }
    ptStack_30 = ptStack_30 + -1;
    local_40 = (word *)(&local_40->w_float + -2);
    w._4_4_ = w._4_4_ + -1;
  }
  hang_free(h);
  return;
}

Assistant:

static void hang_tick(t_hang *h)
{
    t_pipe *x = h->h_owner;
    t_hang *h2, *h3;
    t_pipeout *p;
    int i;
    union word *w;
    if (x->x_hang == h) x->x_hang = h->h_next;
    else for (h2 = x->x_hang; (h3 = h2->h_next); h2 = h3)
    {
        if (h3 == h)
        {
            h2->h_next = h3->h_next;
            break;
        }
    }
    for (i = x->x_n, p = x->x_vec + (x->x_n - 1), w = h->h_vec + (x->x_n - 1);
        i--; p--, w--)
    {
        switch (p->p_atom.a_type)
        {
        case A_FLOAT: outlet_float(p->p_outlet, w->w_float); break;
        case A_SYMBOL: outlet_symbol(p->p_outlet, w->w_symbol); break;
        case A_POINTER:
            if (gpointer_check(w->w_gpointer, 1))
                outlet_pointer(p->p_outlet, w->w_gpointer);
            else pd_error(x, "pipe: stale pointer");
            break;
        default: break;
        }
    }
    hang_free(h);
}